

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ResultBuilder::captureExpression(ResultBuilder *this)

{
  char cVar1;
  int iVar2;
  IResultCapture *pIVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  undefined1 local_d8 [8];
  AssertionResult result;
  
  build((AssertionResult *)local_d8,this);
  pIVar3 = getResultCapture();
  (*pIVar3->_vptr_IResultCapture[2])(pIVar3,local_d8);
  if (((result.m_resultData.message.field_2._M_local_buf[8] & 0x10U) != 0) &&
     ((result.m_info.capturedExpression.field_2._8_4_ & 8) == 0)) {
    pIVar4 = getCurrentMutableContext();
    (*(pIVar4->super_IContext)._vptr_IContext[6])(&result.m_resultData.resultType,pIVar4);
    cVar1 = (**(code **)(*(long *)result.m_resultData._64_8_ + 0x40))();
    Ptr<const_Catch::IConfig>::~Ptr((Ptr<const_Catch::IConfig> *)&result.m_resultData.resultType);
    if (cVar1 != '\0') {
      this->m_shouldDebugBreak = true;
    }
    pIVar4 = getCurrentMutableContext();
    iVar2 = (*(pIVar4->super_IContext)._vptr_IContext[3])(pIVar4);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if ((cVar1 != '\0') || (((this->m_assertionInfo).resultDisposition & Normal) != 0)) {
      this->m_shouldThrow = true;
    }
  }
  AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  return;
}

Assistant:

void ResultBuilder::captureExpression() {
        AssertionResult result = build();
        getResultCapture().assertionEnded( result );

        if( !result.isOk() ) {
            if( getCurrentContext().getConfig()->shouldDebugBreak() )
                m_shouldDebugBreak = true;
            if( getCurrentContext().getRunner()->aborting() || (m_assertionInfo.resultDisposition & ResultDisposition::Normal) )
                m_shouldThrow = true;
        }
    }